

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmServerConnection.cxx
# Opt level: O0

uv_stream_ptr __thiscall cmStdIoConnection::SetupStream(cmStdIoConnection *this,int file_id)

{
  uv_handle_type uVar1;
  uv_tty_s *tty_00;
  uv_loop_t *puVar2;
  uv_pipe_s *handle;
  uv_file in_EDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  undefined4 in_register_00000034;
  uv_stream_ptr uVar4;
  undefined1 local_50 [8];
  uv_pipe_ptr pipe;
  undefined1 local_30 [8];
  uv_tty_ptr tty;
  int file_id_local;
  cmStdIoConnection *this_local;
  
  tty.super_uv_handle_ptr_<uv_tty_s>.super_uv_handle_ptr_base_<uv_tty_s>.handle.
  super___shared_ptr<uv_tty_s,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ = in_EDX;
  uVar1 = uv_guess_handle(in_EDX);
  if (uVar1 != UV_NAMED_PIPE) {
    if (uVar1 == UV_TTY) {
      ::cm::uv_tty_ptr::uv_tty_ptr((uv_tty_ptr *)local_30);
      puVar2 = cmServerBase::GetLoop(*(cmServerBase **)(CONCAT44(in_register_00000034,file_id) + 8))
      ;
      ::cm::uv_tty_ptr::init((uv_tty_ptr *)local_30,(EVP_PKEY_CTX *)puVar2);
      tty_00 = ::cm::uv_handle_ptr_::operator_cast_to_uv_tty_s_((uv_handle_ptr_ *)local_30);
      uv_tty_set_mode(tty_00,UV_TTY_MODE_NORMAL);
      ::cm::uv_handle_ptr_<uv_stream_s>::uv_handle_ptr_base_<cm::uv_tty_ptr,void>
                ((uv_handle_ptr_<uv_stream_s> *)this,(uv_tty_ptr *)local_30);
      ::cm::uv_tty_ptr::~uv_tty_ptr((uv_tty_ptr *)local_30);
      _Var3._M_pi = extraout_RDX;
      goto LAB_00604cb7;
    }
    if (uVar1 != UV_FILE) {
      __assert_fail("false && \"Unable to determine stream type\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmServerConnection.cxx"
                    ,0x31,"cm::uv_stream_ptr cmStdIoConnection::SetupStream(int)");
    }
    if (tty.super_uv_handle_ptr_<uv_tty_s>.super_uv_handle_ptr_base_<uv_tty_s>.handle.
        super___shared_ptr<uv_tty_s,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ == 0) {
      ::cm::uv_handle_ptr_<uv_stream_s>::uv_handle_ptr_base_
                ((uv_handle_ptr_<uv_stream_s> *)this,(nullptr_t)0x0);
      _Var3._M_pi = extraout_RDX_00;
      goto LAB_00604cb7;
    }
  }
  ::cm::uv_pipe_ptr::uv_pipe_ptr((uv_pipe_ptr *)local_50);
  puVar2 = cmServerBase::GetLoop(*(cmServerBase **)(CONCAT44(in_register_00000034,file_id) + 8));
  ::cm::uv_pipe_ptr::init((uv_pipe_ptr *)local_50,(EVP_PKEY_CTX *)puVar2);
  handle = ::cm::uv_handle_ptr_::operator_cast_to_uv_pipe_s_((uv_handle_ptr_ *)local_50);
  uv_pipe_open(handle,tty.super_uv_handle_ptr_<uv_tty_s>.super_uv_handle_ptr_base_<uv_tty_s>.handle.
                      super___shared_ptr<uv_tty_s,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
                      _4_4_);
  ::cm::uv_handle_ptr_<uv_stream_s>::uv_handle_ptr_base_<cm::uv_pipe_ptr,void>
            ((uv_handle_ptr_<uv_stream_s> *)this,(uv_pipe_ptr *)local_50);
  ::cm::uv_pipe_ptr::~uv_pipe_ptr((uv_pipe_ptr *)local_50);
  _Var3._M_pi = extraout_RDX_01;
LAB_00604cb7:
  uVar4.super_uv_handle_ptr_base_<uv_stream_s>.handle.
  super___shared_ptr<uv_stream_s,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var3._M_pi;
  uVar4.super_uv_handle_ptr_base_<uv_stream_s>.handle.
  super___shared_ptr<uv_stream_s,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (uv_stream_ptr)
         uVar4.super_uv_handle_ptr_base_<uv_stream_s>.handle.
         super___shared_ptr<uv_stream_s,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

cm::uv_stream_ptr cmStdIoConnection::SetupStream(int file_id)
{
  switch (uv_guess_handle(file_id)) {
    case UV_TTY: {
      cm::uv_tty_ptr tty;
      tty.init(*this->Server->GetLoop(), file_id, file_id == 0,
               static_cast<cmEventBasedConnection*>(this));
      uv_tty_set_mode(tty, UV_TTY_MODE_NORMAL);
      return { std::move(tty) };
    }
    case UV_FILE:
      if (file_id == 0) {
        return nullptr;
      }
      // Intentional fallthrough; stdin can _not_ be treated as a named
      // pipe, however stdout can be.
      CM_FALLTHROUGH;
    case UV_NAMED_PIPE: {
      cm::uv_pipe_ptr pipe;
      pipe.init(*this->Server->GetLoop(), 0,
                static_cast<cmEventBasedConnection*>(this));
      uv_pipe_open(pipe, file_id);
      return { std::move(pipe) };
    }
    default:
      assert(false && "Unable to determine stream type");
      return nullptr;
  }
}